

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache_tests.cpp
# Opt level: O2

void __thiscall
cuckoocache_tests::test_cuckoocache_no_fakes::test_method(test_cuckoocache_no_fakes *this)

{
  uint256 e;
  FastRandomContext *this_00;
  int iVar1;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  bool bVar2;
  const_string msg;
  const_string file;
  check_type cVar3;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  lazy_ostream local_130;
  undefined1 *local_120;
  char **local_118;
  assertion_result local_110;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  cache<uint256,_SignatureCacheHasher> cc;
  uint256 local_78;
  uint256 local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::SeedRandomForTest(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,ZEROS);
  CuckooCache::cache<uint256,_SignatureCacheHasher>::cache(&cc);
  CuckooCache::cache<uint256,_SignatureCacheHasher>::setup_bytes(&cc,0x400000);
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng;
  iVar1 = 100000;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    RandomMixin<FastRandomContext>::rand256
              (&local_58,&this_00->super_RandomMixin<FastRandomContext>);
    e.super_base_blob<256U>.m_data._M_elems[8] = local_58.super_base_blob<256U>.m_data._M_elems[8];
    e.super_base_blob<256U>.m_data._M_elems[9] = local_58.super_base_blob<256U>.m_data._M_elems[9];
    e.super_base_blob<256U>.m_data._M_elems[10] = local_58.super_base_blob<256U>.m_data._M_elems[10]
    ;
    e.super_base_blob<256U>.m_data._M_elems[0xb] =
         local_58.super_base_blob<256U>.m_data._M_elems[0xb];
    e.super_base_blob<256U>.m_data._M_elems[0xc] =
         local_58.super_base_blob<256U>.m_data._M_elems[0xc];
    e.super_base_blob<256U>.m_data._M_elems[0xd] =
         local_58.super_base_blob<256U>.m_data._M_elems[0xd];
    e.super_base_blob<256U>.m_data._M_elems[0xe] =
         local_58.super_base_blob<256U>.m_data._M_elems[0xe];
    e.super_base_blob<256U>.m_data._M_elems[0xf] =
         local_58.super_base_blob<256U>.m_data._M_elems[0xf];
    e.super_base_blob<256U>.m_data._M_elems[0] = local_58.super_base_blob<256U>.m_data._M_elems[0];
    e.super_base_blob<256U>.m_data._M_elems[1] = local_58.super_base_blob<256U>.m_data._M_elems[1];
    e.super_base_blob<256U>.m_data._M_elems[2] = local_58.super_base_blob<256U>.m_data._M_elems[2];
    e.super_base_blob<256U>.m_data._M_elems[3] = local_58.super_base_blob<256U>.m_data._M_elems[3];
    e.super_base_blob<256U>.m_data._M_elems[4] = local_58.super_base_blob<256U>.m_data._M_elems[4];
    e.super_base_blob<256U>.m_data._M_elems[5] = local_58.super_base_blob<256U>.m_data._M_elems[5];
    e.super_base_blob<256U>.m_data._M_elems[6] = local_58.super_base_blob<256U>.m_data._M_elems[6];
    e.super_base_blob<256U>.m_data._M_elems[7] = local_58.super_base_blob<256U>.m_data._M_elems[7];
    e.super_base_blob<256U>.m_data._M_elems[0x10] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x10];
    e.super_base_blob<256U>.m_data._M_elems[0x11] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x11];
    e.super_base_blob<256U>.m_data._M_elems[0x12] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x12];
    e.super_base_blob<256U>.m_data._M_elems[0x13] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x13];
    e.super_base_blob<256U>.m_data._M_elems[0x14] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x14];
    e.super_base_blob<256U>.m_data._M_elems[0x15] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x15];
    e.super_base_blob<256U>.m_data._M_elems[0x16] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x16];
    e.super_base_blob<256U>.m_data._M_elems[0x17] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x17];
    e.super_base_blob<256U>.m_data._M_elems[0x18] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x18];
    e.super_base_blob<256U>.m_data._M_elems[0x19] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x19];
    e.super_base_blob<256U>.m_data._M_elems[0x1a] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x1a];
    e.super_base_blob<256U>.m_data._M_elems[0x1b] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x1b];
    e.super_base_blob<256U>.m_data._M_elems[0x1c] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x1c];
    e.super_base_blob<256U>.m_data._M_elems[0x1d] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x1d];
    e.super_base_blob<256U>.m_data._M_elems[0x1e] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x1e];
    e.super_base_blob<256U>.m_data._M_elems[0x1f] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x1f];
    _cVar3 = (check_type)local_58.super_base_blob<256U>.m_data._M_elems._8_8_;
    CuckooCache::cache<uint256,_SignatureCacheHasher>::insert(&cc,e);
  }
  iVar1 = 100000;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    local_e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
    ;
    local_e0 = "";
    local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x30;
    file.m_begin = (iterator)&local_e8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f8,msg);
    RandomMixin<FastRandomContext>::rand256
              (&local_78,&this_00->super_RandomMixin<FastRandomContext>);
    bVar2 = CuckooCache::cache<uint256,_SignatureCacheHasher>::contains(&cc,&local_78,false);
    local_110.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)!bVar2;
    local_110.m_message.px = (element_type *)0x0;
    local_110.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_140 = "!cc.contains(m_rng.rand256(), false)";
    local_138 = "";
    local_130.m_empty = false;
    local_130._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
    local_120 = boost::unit_test::lazy_ostream::inst;
    local_118 = &local_140;
    local_150 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
    ;
    local_148 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_110,&local_130,1,0,WARN,_cVar3,(size_t)&local_150,0x30);
    boost::detail::shared_count::~shared_count(&local_110.m_message.pn);
  }
  CuckooCache::cache<uint256,_SignatureCacheHasher>::~cache(&cc);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_cuckoocache_no_fakes)
{
    SeedRandomForTest(SeedRand::ZEROS);
    CuckooCache::cache<uint256, SignatureCacheHasher> cc{};
    size_t megabytes = 4;
    cc.setup_bytes(megabytes << 20);
    for (int x = 0; x < 100000; ++x) {
        cc.insert(m_rng.rand256());
    }
    for (int x = 0; x < 100000; ++x) {
        BOOST_CHECK(!cc.contains(m_rng.rand256(), false));
    }
}